

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O2

Matrix4f *
Matrix4f::infinitePerspectiveProjection
          (Matrix4f *__return_storage_ptr__,float fLeft,float fRight,float fBottom,float fTop,
          float fZNear,bool directX)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined4 in_XMM0_Db;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined1 auVar6 [16];
  undefined4 in_XMM1_Db;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  undefined1 auVar7 [16];
  undefined4 in_XMM4_Db;
  undefined4 in_XMM4_Dc;
  undefined4 in_XMM4_Dd;
  
  Matrix4f(__return_storage_ptr__,0.0);
  auVar1._4_4_ = in_XMM1_Db;
  auVar1._0_4_ = fRight;
  auVar1._8_4_ = in_XMM1_Dc;
  auVar1._12_4_ = in_XMM1_Dd;
  auVar2._4_4_ = in_XMM0_Db;
  auVar2._0_4_ = fLeft;
  auVar2._8_4_ = in_XMM0_Dc;
  auVar2._12_4_ = in_XMM0_Dd;
  auVar4._4_4_ = in_XMM4_Db;
  auVar4._0_4_ = fZNear;
  auVar4._8_4_ = in_XMM4_Dc;
  auVar4._12_4_ = in_XMM4_Dd;
  auVar5 = vinsertps_avx(auVar1,ZEXT416((uint)fTop),0x10);
  auVar1 = vinsertps_avx(auVar2,ZEXT416((uint)fBottom),0x10);
  auVar3 = vsubps_avx(auVar5,auVar1);
  __return_storage_ptr__->m_elements[0] = (fZNear + fZNear) / auVar3._0_4_;
  auVar2 = vmovshdup_avx(auVar3);
  __return_storage_ptr__->m_elements[5] = (fZNear + fZNear) / auVar2._0_4_;
  auVar6._0_4_ = auVar1._0_4_ + auVar5._0_4_;
  auVar6._4_4_ = auVar1._4_4_ + auVar5._4_4_;
  auVar6._8_4_ = auVar1._8_4_ + auVar5._8_4_;
  auVar6._12_4_ = auVar1._12_4_ + auVar5._12_4_;
  auVar7._8_4_ = 0xbf800000;
  auVar7._0_8_ = 0xbf800000bf800000;
  auVar7._12_4_ = 0xbf800000;
  auVar5 = vdivps_avx(auVar6,auVar3);
  auVar5 = vmovlhps_avx(auVar5,auVar7);
  *(undefined1 (*) [16])(__return_storage_ptr__->m_elements + 8) = auVar5;
  auVar5._8_4_ = 0x80000000;
  auVar5._0_8_ = 0x8000000080000000;
  auVar5._12_4_ = 0x80000000;
  auVar5 = vxorps_avx512vl(auVar4,auVar5);
  __return_storage_ptr__->m_elements[0xe] =
       (float)((uint)directX * auVar5._0_4_ + (uint)!directX * (int)(fZNear * -2.0));
  return __return_storage_ptr__;
}

Assistant:

Matrix4f Matrix4f::infinitePerspectiveProjection( float fLeft, float fRight,
												 float fBottom, float fTop,
												 float fZNear, bool directX )
{
	Matrix4f projection;

	projection( 0, 0 ) = ( 2.0f * fZNear ) / ( fRight - fLeft );
	projection( 1, 1 ) = ( 2.0f * fZNear ) / ( fTop - fBottom );
	projection( 0, 2 ) = ( fRight + fLeft ) / ( fRight - fLeft );
	projection( 1, 2 ) = ( fTop + fBottom ) / ( fTop - fBottom );
	projection( 3, 2 ) = -1;

	// infinite view frustum
	// just take the limit as far --> inf of the regular frustum
	if( directX )
	{
		projection( 2, 2 ) = -1.0f;
		projection( 2, 3 ) = -fZNear;		
	}
	else
	{
		projection( 2, 2 ) = -1.0f;
		projection( 2, 3 ) = -2.0f * fZNear;
	}

	return projection;
}